

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  byte local_c1;
  str_attr_accessor local_b0;
  none local_90;
  byte local_81;
  str_attr_accessor local_80;
  handle local_50;
  PyObject *local_48;
  obj_attr_accessor local_40;
  cpp_function *local_20;
  cpp_function *cf_local;
  char *name__local;
  object *cls_local;
  
  local_20 = cf;
  cf_local = (cpp_function *)name_;
  name__local = (char *)cls;
  cpp_function::name((cpp_function *)&local_50);
  local_48 = local_50.m_ptr;
  object_api<pybind11::handle>::attr(&local_40,(object_api<pybind11::handle> *)cls,local_50);
  accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_40,cf);
  accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_40);
  object::~object((object *)&local_50);
  iVar2 = strcmp((char *)cf_local,"__eq__");
  local_81 = 0;
  local_c1 = 0;
  if (iVar2 == 0) {
    object_api<pybind11::handle>::attr
              (&local_80,(object_api<pybind11::handle> *)name__local,"__dict__");
    local_81 = 1;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)&local_80,(char (*) [9])"__hash__");
    local_c1 = bVar1 ^ 0xff;
  }
  if ((local_81 & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_80);
  }
  if ((local_c1 & 1) != 0) {
    none::none(&local_90);
    object_api<pybind11::handle>::attr
              (&local_b0,(object_api<pybind11::handle> *)name__local,"__hash__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_b0,&local_90);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_b0);
    none::~none(&local_90);
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}